

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O1

char * pstore::utf::index(char *__s,int __c)

{
  size_t sVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  size_t start_count;
  undefined8 local_28;
  
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    local_28 = 0;
    pcVar2 = std::
             __find_if<char_const*,__gnu_cxx::__ops::_Iter_pred<pstore::utf::index<char_const*>(char_const*,char_const*,unsigned_long)::_lambda(char)_1_>>
                       (__s,__s + sVar1,&local_28,CONCAT44(in_register_00000034,__c));
    if (pcVar2 == __s + sVar1) {
      pcVar2 = (char *)0x0;
    }
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

auto index (gsl::czstring const str, std::size_t const pos) -> gsl::czstring {
            if (str == nullptr) {
                return nullptr;
            }
            gsl::czstring const end = str + std::strlen (str);
            gsl::czstring const result = index (str, end, pos);
            return result == end ? nullptr : result;
        }